

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O2

void __thiscall
Assimp::AMFImporter::Throw_MoreThanOnceDefined
          (AMFImporter *this,string *pNodeType,string *pDescription)

{
  int iVar1;
  DeadlyImportError *this_00;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::operator+(&bStack_c8,"\"",pNodeType);
  std::operator+(&local_a8,&bStack_c8,"\" node can be used only once in ");
  iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
  std::operator+(&local_88,&local_a8,(char *)CONCAT44(extraout_var,iVar1));
  std::operator+(&local_68,&local_88,". Description: ");
  std::operator+(&local_48,&local_68,pDescription);
  DeadlyImportError::DeadlyImportError(this_00,&local_48);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void AMFImporter::Throw_MoreThanOnceDefined(const std::string& pNodeType, const std::string& pDescription)
{
	throw DeadlyImportError("\"" + pNodeType + "\" node can be used only once in " + mReader->getNodeName() + ". Description: " + pDescription);
}